

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

int matching_node(lyd_node *node1,lyd_node *node2)

{
  int iVar1;
  
  if (node1 == (lyd_node *)0x0 && node2 == (lyd_node *)0x0) {
    __assert_fail("node1 || node2",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                  ,0x4a,"int matching_node(const struct lyd_node *, const struct lyd_node *)");
  }
  iVar1 = 0;
  if ((node1 != (lyd_node *)0x0 && node2 != (lyd_node *)0x0) && (node1->schema == node2->schema)) {
    iVar1 = 1;
    if ((node1->schema == (lysc_node *)0x0) &&
       ((node1[1].schema != node2[1].schema || (node1[1].parent != node2[1].parent)))) {
      return 0;
    }
  }
  return iVar1;
}

Assistant:

static int
matching_node(const struct lyd_node *node1, const struct lyd_node *node2)
{
    assert(node1 || node2);

    if (!node1 || !node2) {
        return 0;
    } else if (node1->schema != node2->schema) {
        return 0;
    }
    if (!node1->schema) {
        /* compare node names */
        struct lyd_node_opaq *onode1 = (struct lyd_node_opaq *)node1;
        struct lyd_node_opaq *onode2 = (struct lyd_node_opaq *)node2;

        if ((onode1->name.name != onode2->name.name) || (onode1->name.prefix != onode2->name.prefix)) {
            return 0;
        }
    }

    return 1;
}